

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmize.c
# Opt level: O0

size_t zero_waveforms(xm_context_t *ctx)

{
  ushort *puVar1;
  char *pcVar2;
  long in_RDI;
  size_t saved_bytes;
  xm_sample_t *sample;
  xm_instrument_t *inst;
  size_t total_saved_bytes;
  size_t j;
  size_t i;
  uint local_3c;
  size_t local_20;
  ulong local_18;
  ulong local_10;
  
  local_20 = 0;
  for (local_10 = 0; local_10 < *(ushort *)(in_RDI + 0x10); local_10 = local_10 + 1) {
    puVar1 = (ushort *)(*(long *)(in_RDI + 0x120) + local_10 * 0xf8);
    for (local_18 = 0; local_18 < *puVar1; local_18 = local_18 + 1) {
      pcVar2 = (char *)(*(long *)(puVar1 + 0x78) + local_18 * 0x38);
      if (*pcVar2 == '\b') {
        local_3c = *(uint *)(pcVar2 + 4);
      }
      else {
        local_3c = *(int *)(pcVar2 + 4) << 1;
      }
      memset(*(void **)(pcVar2 + 0x30),0,(ulong)local_3c);
      local_20 = local_3c + local_20;
    }
  }
  return local_20;
}

Assistant:

static size_t zero_waveforms(xm_context_t* ctx) {
	size_t i, j, total_saved_bytes = 0;

	for(i = 0; i < ctx->module.num_instruments; ++i) {
		xm_instrument_t* inst = &(ctx->module.instruments[i]);

		for(j = 0; j < inst->num_samples; ++j) {
			xm_sample_t* sample = &(inst->samples[j]);

			size_t saved_bytes = (sample->bits == 8) ? sample->length : sample->length * 2;
			memset(sample->data8, 0, saved_bytes);
			total_saved_bytes += saved_bytes;
		}
	}

	return total_saved_bytes;
}